

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O3

void __thiscall duel::initializeField_(duel *this)

{
  uint uVar1;
  _Elt_pointer pcVar2;
  
  pcVar2 = (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pcVar2 != (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    do {
      if (pcVar2 == (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        pcVar2 = (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      std::vector<card,std::allocator<card>>::emplace_back<card&>
                ((vector<card,std::allocator<card>> *)&(this->field1).field_,pcVar2 + -1);
      std::deque<card,_std::allocator<card>_>::pop_back(&(this->deck).c);
      pcVar2 = (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      (this->field1).pile =
           (this->field1).pile +
           (this->field1).field_.super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].value;
      if (pcVar2 == (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        pcVar2 = (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      std::vector<card,std::allocator<card>>::emplace_back<card&>
                ((vector<card,std::allocator<card>> *)&(this->field2).field_,pcVar2 + -1);
      std::deque<card,_std::allocator<card>_>::pop_back(&(this->deck).c);
      uVar1 = (this->field2).field_.super__Vector_base<card,_std::allocator<card>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].value + (this->field2).pile;
      (this->field2).pile = uVar1;
      if ((this->field1).pile != uVar1) {
        return;
      }
      (this->field1).pile = 0;
      (this->field2).pile = 0;
      field::clearField(&this->field1);
      field::clearField(&this->field2);
      pcVar2 = (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    } while (pcVar2 != (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur);
  }
  this->duelEnd = true;
  return;
}

Assistant:

void duel::initializeField_() {
    // checks if deck empty, then tie
    if(deck.empty()) {
        duelEnd = true;
        return;
    }
    // puts a card from each deck onto the field
    field1.field_.emplace_back(deck.top());
    deck.pop();
    field1.setPile(field1.getPile()+field1.field_.back().getValue());
    field2.field_.emplace_back(deck.top());
    deck.pop();
    field2.setPile(field2.getPile()+field2.field_.back().getValue());
    // if piles are of equal value then reset field and draw again
    if(equalValue()) {
        resetField();
        initializeField_();
    }
}